

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempTracker.cpp
# Opt level: O1

void __thiscall
TempTrackerBase::OrHashTableOfBitVector
          (TempTrackerBase *this,
          HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *toData,
          HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> **fromData,
          bool deleteData)

{
  int iVar1;
  HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *pHVar2;
  SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
  *pSVar3;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  code *pcVar4;
  HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> **ppHVar5;
  bool bVar6;
  undefined4 *puVar7;
  Type *pTVar8;
  Type *pTVar9;
  Type *pTVar10;
  BVSparse<Memory::JitArenaAllocator> *pBVar11;
  ulong uVar12;
  EditingIterator local_78;
  HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> **local_60;
  TempTrackerBase *local_58;
  undefined4 *local_50;
  HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *local_48;
  undefined1 local_40 [8];
  Iterator iter2;
  
  local_58 = this;
  local_48 = toData;
  if (toData == (HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/TempTracker.cpp"
                       ,0x91,"(toData != nullptr)","toData != nullptr");
    if (!bVar6) goto LAB_00638710;
    *puVar7 = 0;
  }
  if (*fromData == (HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *)0x0)
  {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/TempTracker.cpp"
                       ,0x92,"(fromData != nullptr)","fromData != nullptr");
    if (!bVar6) {
LAB_00638710:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar7 = 0;
  }
  local_60 = fromData;
  if (local_48->tableSize != 0) {
    pHVar2 = *fromData;
    local_50 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    uVar12 = 0;
    do {
      local_40 = (undefined1  [8])(pHVar2->table + uVar12);
      iter2.list = (SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
                    *)local_40;
      if (local_40 == (undefined1  [8])0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = local_50;
        *local_50 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar6) goto LAB_00638710;
        *puVar7 = 0;
      }
      pSVar3 = (SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
                *)((iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
      iter2.list = (SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
                    *)0x0;
      if ((undefined1  [8])pSVar3 != local_40) {
        iter2.list = pSVar3;
      }
      local_78.super_Iterator.list = local_48->table + uVar12;
      local_78.last = (NodeBase *)0x0;
      local_78.super_Iterator.current =
           &(local_78.super_Iterator.list)->super_SListNodeBase<Memory::ArenaAllocator>;
      while (bVar6 = SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
                     ::EditingIterator::Next(&local_78), bVar6) {
        pTVar8 = SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
                 ::Iterator::Data(&local_78.super_Iterator);
        if ((iter2.list !=
             (SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
              *)0x0) && ((undefined1  [8])iter2.list != local_40)) {
          while (iVar1 = pTVar8->value,
                pTVar9 = SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
                         ::Iterator::Data((Iterator *)local_40), iVar1 < pTVar9->value) {
            pTVar9 = SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
                     ::EditingIterator::InsertNodeBefore(&local_78,local_48->alloc);
            pTVar10 = SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
                      ::Iterator::Data((Iterator *)local_40);
            pTVar9->value = pTVar10->value;
            pTVar10 = SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
                      ::Iterator::Data((Iterator *)local_40);
            pBVar11 = pTVar10->element;
            if (!deleteData) {
              pBVar11 = BVSparse<Memory::JitArenaAllocator>::CopyNew
                                  (pBVar11,(local_58->nonTempSyms).alloc);
            }
            pTVar9->element = pBVar11;
            if (iter2.list ==
                (SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
                 *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar7 = local_50;
              *local_50 = 1;
              bVar6 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                 ,0x76,"(current != nullptr)","current != nullptr");
              if (!bVar6) goto LAB_00638710;
              *puVar7 = 0;
            }
            pSVar3 = (SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
                      *)((iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
            iter2.list = (SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
                          *)0x0;
            if ((undefined1  [8])pSVar3 != local_40) {
              iter2.list = pSVar3;
            }
            if ((iter2.list ==
                 (SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
                  *)0x0) || ((undefined1  [8])iter2.list == local_40)) break;
          }
        }
        if ((iter2.list ==
             (SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
              *)0x0) || ((undefined1  [8])iter2.list == local_40)) break;
        iVar1 = pTVar8->value;
        pTVar9 = SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
                 ::Iterator::Data((Iterator *)local_40);
        if (iVar1 == pTVar9->value) {
          pBVar11 = pTVar8->element;
          pTVar9 = SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
                   ::Iterator::Data((Iterator *)local_40);
          this_00 = pTVar9->element;
          if (pBVar11 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
            pBVar11 = this_00;
            if (!deleteData) {
              pBVar11 = BVSparse<Memory::JitArenaAllocator>::CopyNew
                                  (this_00,(local_58->nonTempSyms).alloc);
            }
          }
          else {
            BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
                      (pBVar11,this_00);
            if (deleteData) {
              Memory::
              DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
                        ((local_58->nonTempSyms).alloc,this_00);
            }
          }
          pTVar8->element = pBVar11;
          if (iter2.list ==
              (SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
               *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar7 = local_50;
            *local_50 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                               ,0x76,"(current != nullptr)","current != nullptr");
            if (!bVar6) goto LAB_00638710;
            *puVar7 = 0;
          }
          pSVar3 = (SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
                    *)((iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
          iter2.list = (SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
                        *)0x0;
          if ((undefined1  [8])pSVar3 != local_40) {
            iter2.list = pSVar3;
          }
        }
      }
      if ((iter2.list !=
           (SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
            *)0x0) && ((undefined1  [8])iter2.list != local_40)) {
        do {
          pTVar8 = SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
                   ::EditingIterator::InsertNodeBefore(&local_78,local_48->alloc);
          pTVar9 = SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
                   ::Iterator::Data((Iterator *)local_40);
          pTVar8->value = pTVar9->value;
          pTVar9 = SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
                   ::Iterator::Data((Iterator *)local_40);
          pBVar11 = pTVar9->element;
          if (!deleteData) {
            pBVar11 = BVSparse<Memory::JitArenaAllocator>::CopyNew
                                (pBVar11,(local_58->nonTempSyms).alloc);
          }
          puVar7 = local_50;
          pTVar8->element = pBVar11;
          if (iter2.list ==
              (SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
               *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar7 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                               ,0x76,"(current != nullptr)","current != nullptr");
            if (!bVar6) goto LAB_00638710;
            *puVar7 = 0;
          }
          pSVar3 = (SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
                    *)((iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
          iter2.list = (SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
                        *)0x0;
          if ((undefined1  [8])pSVar3 != local_40) {
            iter2.list = pSVar3;
          }
        } while ((iter2.list !=
                  (SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
                   *)0x0) && ((undefined1  [8])iter2.list != local_40));
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < local_48->tableSize);
  }
  ppHVar5 = local_60;
  if (deleteData) {
    pHVar2 = *local_60;
    Memory::
    DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,HashTable<BVSparse<Memory::JitArenaAllocator>*,Memory::ArenaAllocator>>
              (pHVar2->alloc,pHVar2,(ulong)pHVar2->tableSize << 4);
    *ppHVar5 = (HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *)0x0;
  }
  return;
}

Assistant:

void
TempTrackerBase::OrHashTableOfBitVector(HashTable<BVSparse<JitArenaAllocator> *> * toData, HashTable<BVSparse<JitArenaAllocator> *> *& fromData, bool deleteData)
{
    Assert(toData != nullptr);
    Assert(fromData != nullptr);
    toData->Or(fromData,
        [=](BVSparse<JitArenaAllocator> * bv1, BVSparse<JitArenaAllocator> * bv2) -> BVSparse<JitArenaAllocator> *
    {
        if (bv1 == nullptr)
        {
            if (deleteData)
            {
                return bv2;
            }
            return bv2->CopyNew(this->GetAllocator());
        }
        bv1->Or(bv2);
        if (deleteData)
        {
            JitAdelete(this->GetAllocator(), bv2);
        }
        return bv1;
    });

    if (deleteData)
    {
        fromData->Delete();
        fromData = nullptr;
    }
}